

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>
               (array<unsigned_char,_32UL> *container)

{
  anon_class_16_2_625a9a03 __gen;
  result_type rVar1;
  iterator __last;
  default_random_engine eng;
  random_device rnd;
  uniform_int_distribution<unsigned_int> dist;
  result_type_conflict in_stack_ffffffffffffec28;
  uniform_int_distribution<unsigned_int> *in_stack_ffffffffffffec30;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *this;
  undefined4 in_stack_ffffffffffffec38;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_1398;
  random_device *in_stack_ffffffffffffec70;
  default_random_engine local_10 [2];
  
  std::numeric_limits<unsigned_char>::max();
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            (in_stack_ffffffffffffec30,(uint)(in_stack_ffffffffffffec28 >> 0x20),
             (uint)in_stack_ffffffffffffec28);
  this = &local_1398;
  std::random_device::random_device(in_stack_ffffffffffffec70);
  rVar1 = std::random_device::operator()((random_device *)0x13de2f);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(this,in_stack_ffffffffffffec28);
  __last = std::array<unsigned_char,_32UL>::begin((array<unsigned_char,_32UL> *)0x13de56);
  std::array<unsigned_char,_32UL>::end((array<unsigned_char,_32UL> *)0x13de67);
  __gen.dist._4_4_ = rVar1;
  __gen.dist._0_4_ = in_stack_ffffffffffffec38;
  __gen.eng = local_10;
  std::
  generate<unsigned_char*,(anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>(std::array<unsigned_char,32ul>&)::_lambda()_1_>
            ((uchar *)this,__last,__gen);
  std::random_device::~random_device((random_device *)0x13dea0);
  return;
}

Assistant:

void randomize_container(C& container) {
    std::uniform_int_distribution<unsigned int> dist{
        0, std::numeric_limits<typename C::value_type>::max()};
    std::random_device rnd;
    std::default_random_engine eng(rnd());
    std::generate(container.begin(), container.end(), [&dist, &eng] { return dist(eng); });
  }